

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_copy(fy_document *fyd,fy_node *fyn_from)

{
  fy_node *fyn;
  fy_node *fyn_from_local;
  fy_document *fyd_local;
  
  if (fyd == (fy_document *)0x0) {
    fyd_local = (fy_document *)0x0;
  }
  else {
    fyd_local = (fy_document *)fy_node_copy_internal(fyd,fyn_from,(fy_node *)0x0);
    if (fyd_local == (fy_document *)0x0) {
      fyd->diag->field_0x3c = fyd->diag->field_0x3c & 0xfe;
      fyd_local = (fy_document *)0x0;
    }
  }
  return (fy_node *)fyd_local;
}

Assistant:

struct fy_node *fy_node_copy(struct fy_document *fyd, struct fy_node *fyn_from) {
    struct fy_node *fyn;

    if (!fyd)
        return NULL;

    fyn = fy_node_copy_internal(fyd, fyn_from, NULL);
    if (!fyn) {
        fyd->diag->on_error = false;
        return NULL;
    }

    return fyn;
}